

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)16>_> *
vkt::api::anon_unknown_1::PipelineLayout::create
          (Move<vk::Handle<(vk::HandleType)16>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *params)

{
  bool bVar1;
  size_type sVar2;
  const_reference local_88;
  const_reference local_78;
  undefined1 local_58 [8];
  VkPipelineLayoutCreateInfo pipelineLayoutInfo;
  Parameters *params_local;
  Resources *res_local;
  Environment *env_local;
  
  local_58._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  pipelineLayoutInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineLayoutInfo._4_4_ = 0;
  pipelineLayoutInfo.pNext._0_4_ = 0;
  pipelineLayoutInfo.pPushConstantRanges = (VkPushConstantRange *)params;
  sVar2 = std::
          vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
          size(&res->pSetLayouts);
  pipelineLayoutInfo.pNext._4_4_ = (undefined4)sVar2;
  bVar1 = std::
          vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
          empty(&res->pSetLayouts);
  if (bVar1) {
    local_78 = (const_reference)0x0;
  }
  else {
    local_78 = std::
               vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
               ::operator[](&res->pSetLayouts,0);
  }
  pipelineLayoutInfo._16_8_ = local_78;
  sVar2 = std::vector<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>::size
                    ((vector<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_> *)
                     (pipelineLayoutInfo.pPushConstantRanges + 2));
  pipelineLayoutInfo.pSetLayouts._0_4_ = (undefined4)sVar2;
  bVar1 = std::vector<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>::empty
                    ((vector<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_> *)
                     (pipelineLayoutInfo.pPushConstantRanges + 2));
  if (bVar1) {
    local_88 = (const_reference)0x0;
  }
  else {
    local_88 = std::vector<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>::
               operator[]((vector<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                           *)(pipelineLayoutInfo.pPushConstantRanges + 2),0);
  }
  pipelineLayoutInfo._32_8_ = local_88;
  ::vk::createPipelineLayout
            (__return_storage_ptr__,env->vkd,env->device,(VkPipelineLayoutCreateInfo *)local_58,
             env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkPipelineLayout> create (const Environment& env, const Resources& res, const Parameters& params)
	{
		const VkPipelineLayoutCreateInfo	pipelineLayoutInfo	=
		{
			VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,
			DE_NULL,
			(VkPipelineLayoutCreateFlags)0,
			(deUint32)res.pSetLayouts.size(),
			(res.pSetLayouts.empty() ? DE_NULL : &res.pSetLayouts[0]),
			(deUint32)params.pushConstantRanges.size(),
			(params.pushConstantRanges.empty() ? DE_NULL : &params.pushConstantRanges[0]),
		};

		return createPipelineLayout(env.vkd, env.device, &pipelineLayoutInfo, env.allocationCallbacks);
	}